

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_2::ValidateLoad(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  AddressingModel AVar4;
  Op OVar5;
  int32_t iVar6;
  uint id;
  uint32_t uVar7;
  DiagnosticStream *pDVar8;
  Feature *pFVar9;
  spv_const_validator_options psVar10;
  DiagnosticStream local_c00;
  spv_result_t local_a24;
  undefined1 local_a20 [4];
  spv_result_t error;
  string local_848;
  string local_828;
  DiagnosticStream local_808;
  Instruction *local_630;
  Instruction *pointee_type;
  DiagnosticStream local_608;
  Instruction *local_430;
  Instruction *pointer_type;
  DiagnosticStream local_408;
  Instruction *local_230;
  Instruction *pointer;
  uint pointer_id;
  int pointer_index;
  DiagnosticStream local_200;
  Instruction *local_28;
  Instruction *result_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  result_type = inst;
  inst_local = (Instruction *)_;
  uVar3 = val::Instruction::type_id((Instruction *)inst);
  local_28 = ValidationState_t::FindDef(_,uVar3);
  if (local_28 == (Instruction *)0x0) {
    ValidationState_t::diag
              (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)result_type);
    pDVar8 = DiagnosticStream::operator<<(&local_200,(char (*) [25])"OpLoad Result Type <id> ");
    pIVar1 = inst_local;
    uVar3 = val::Instruction::type_id((Instruction *)result_type);
    ValidationState_t::getIdName_abi_cxx11_((string *)&pointer_id,(ValidationState_t *)pIVar1,uVar3)
    ;
    pDVar8 = DiagnosticStream::operator<<
                       (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pointer_id);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [17])0xf3208b);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    std::__cxx11::string::~string((string *)&pointer_id);
    DiagnosticStream::~DiagnosticStream(&local_200);
    return __local._4_4_;
  }
  pointer._4_4_ = 2;
  pointer._0_4_ = val::Instruction::GetOperandAs<unsigned_int>((Instruction *)result_type,2);
  local_230 = ValidationState_t::FindDef((ValidationState_t *)inst_local,(uint)pointer);
  if (local_230 == (Instruction *)0x0) {
LAB_00b4c97f:
    ValidationState_t::diag
              (&local_408,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)result_type);
    pDVar8 = DiagnosticStream::operator<<(&local_408,(char (*) [21])"OpLoad Pointer <id> ");
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)&pointer_type,(ValidationState_t *)inst_local,(uint)pointer);
    pDVar8 = DiagnosticStream::operator<<
                       (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pointer_type);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [27])" is not a logical pointer.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    std::__cxx11::string::~string((string *)&pointer_type);
    DiagnosticStream::~DiagnosticStream(&local_408);
    return __local._4_4_;
  }
  AVar4 = ValidationState_t::addressing_model((ValidationState_t *)inst_local);
  if (AVar4 == AddressingModelLogical) {
    pFVar9 = ValidationState_t::features((ValidationState_t *)inst_local);
    if ((pFVar9->variable_pointers & 1U) == 0) {
      OVar5 = val::Instruction::opcode(local_230);
      iVar6 = spvOpcodeReturnsLogicalPointer(OVar5);
      if (iVar6 == 0) goto LAB_00b4c97f;
    }
    pFVar9 = ValidationState_t::features((ValidationState_t *)inst_local);
    if ((pFVar9->variable_pointers & 1U) != 0) {
      OVar5 = val::Instruction::opcode(local_230);
      bVar2 = spvOpcodeReturnsLogicalVariablePointer(OVar5);
      if (!bVar2) goto LAB_00b4c97f;
    }
  }
  pIVar1 = inst_local;
  uVar3 = val::Instruction::type_id(local_230);
  local_430 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar3);
  if ((local_430 == (Instruction *)0x0) ||
     ((OVar5 = val::Instruction::opcode(local_430), OVar5 != OpTypePointer &&
      (OVar5 = val::Instruction::opcode(local_430), OVar5 != OpTypeUntypedPointerKHR)))) {
    ValidationState_t::diag
              (&local_608,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)result_type);
    pDVar8 = DiagnosticStream::operator<<(&local_608,(char (*) [30])"OpLoad type for pointer <id> ")
    ;
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)&pointee_type,(ValidationState_t *)inst_local,(uint)pointer);
    pDVar8 = DiagnosticStream::operator<<
                       (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pointee_type);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [24])0xf44afc);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    std::__cxx11::string::~string((string *)&pointee_type);
    DiagnosticStream::~DiagnosticStream(&local_608);
    return __local._4_4_;
  }
  OVar5 = val::Instruction::opcode(local_430);
  pIVar1 = inst_local;
  if (OVar5 == OpTypePointer) {
    id = val::Instruction::GetOperandAs<unsigned_int>(local_430,2);
    local_630 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,id);
    if (local_630 != (Instruction *)0x0) {
      uVar3 = val::Instruction::id(local_28);
      uVar7 = val::Instruction::id(local_630);
      if (uVar3 == uVar7) goto LAB_00b4cc8b;
    }
    ValidationState_t::diag
              (&local_808,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)result_type);
    pDVar8 = DiagnosticStream::operator<<(&local_808,(char (*) [25])"OpLoad Result Type <id> ");
    pIVar1 = inst_local;
    uVar3 = val::Instruction::type_id((Instruction *)result_type);
    ValidationState_t::getIdName_abi_cxx11_(&local_828,(ValidationState_t *)pIVar1,uVar3);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_828);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [30])" does not match Pointer <id> ");
    pIVar1 = inst_local;
    uVar3 = val::Instruction::id(local_230);
    ValidationState_t::getIdName_abi_cxx11_(&local_848,(ValidationState_t *)pIVar1,uVar3);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_848);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [8])"s type.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    std::__cxx11::string::~string((string *)&local_848);
    std::__cxx11::string::~string((string *)&local_828);
    DiagnosticStream::~DiagnosticStream(&local_808);
  }
  else {
LAB_00b4cc8b:
    psVar10 = ValidationState_t::options((ValidationState_t *)inst_local);
    pIVar1 = inst_local;
    if ((psVar10->before_hlsl_legalization & 1U) == 0) {
      uVar3 = val::Instruction::type_id((Instruction *)result_type);
      bVar2 = ValidationState_t::ContainsRuntimeArray((ValidationState_t *)pIVar1,uVar3);
      if (bVar2) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_a20,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_ID,(Instruction *)result_type);
        pDVar8 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_a20,
                            (char (*) [34])"Cannot load a runtime-sized array");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_a20);
        return __local._4_4_;
      }
    }
    local_a24 = CheckMemoryAccess((ValidationState_t *)inst_local,result_type,3);
    __local._4_4_ = local_a24;
    if (local_a24 == SPV_SUCCESS) {
      bVar2 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader);
      pIVar1 = inst_local;
      if (bVar2) {
        uVar3 = val::Instruction::type_id((Instruction *)result_type);
        bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                          ((ValidationState_t *)pIVar1,uVar3);
        if ((((bVar2) && (OVar5 = val::Instruction::opcode(local_28), OVar5 != OpTypePointer)) &&
            (OVar5 = val::Instruction::opcode(local_28), OVar5 != OpTypeInt)) &&
           (((OVar5 = val::Instruction::opcode(local_28), OVar5 != OpTypeFloat &&
             (OVar5 = val::Instruction::opcode(local_28), OVar5 != OpTypeVector)) &&
            (OVar5 = val::Instruction::opcode(local_28), OVar5 != OpTypeMatrix)))) {
          ValidationState_t::diag
                    (&local_c00,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                     (Instruction *)result_type);
          pDVar8 = DiagnosticStream::operator<<
                             (&local_c00,
                              (char (*) [59])
                              "8- or 16-bit loads must be a scalar, vector or matrix type");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream(&local_c00);
          return __local._4_4_;
        }
      }
      ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                ((ValidationState_t *)inst_local,(uint)pointer,(Instruction *)result_type,
                 (Instruction *)0x0);
      __local._4_4_ = SPV_SUCCESS;
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateLoad(ValidationState_t& _, const Instruction* inst) {
  const auto result_type = _.FindDef(inst->type_id());
  if (!result_type) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpLoad Result Type <id> " << _.getIdName(inst->type_id())
           << " is not defined.";
  }

  const auto pointer_index = 2;
  const auto pointer_id = inst->GetOperandAs<uint32_t>(pointer_index);
  const auto pointer = _.FindDef(pointer_id);
  if (!pointer ||
      ((_.addressing_model() == spv::AddressingModel::Logical) &&
       ((!_.features().variable_pointers &&
         !spvOpcodeReturnsLogicalPointer(pointer->opcode())) ||
        (_.features().variable_pointers &&
         !spvOpcodeReturnsLogicalVariablePointer(pointer->opcode()))))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpLoad Pointer <id> " << _.getIdName(pointer_id)
           << " is not a logical pointer.";
  }

  const auto pointer_type = _.FindDef(pointer->type_id());
  if (!pointer_type ||
      (pointer_type->opcode() != spv::Op::OpTypePointer &&
       pointer_type->opcode() != spv::Op::OpTypeUntypedPointerKHR)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpLoad type for pointer <id> " << _.getIdName(pointer_id)
           << " is not a pointer type.";
  }

  if (pointer_type->opcode() == spv::Op::OpTypePointer) {
    const auto pointee_type =
        _.FindDef(pointer_type->GetOperandAs<uint32_t>(2));
    if (!pointee_type || result_type->id() != pointee_type->id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpLoad Result Type <id> " << _.getIdName(inst->type_id())
             << " does not match Pointer <id> " << _.getIdName(pointer->id())
             << "s type.";
    }
  }

  if (!_.options()->before_hlsl_legalization &&
      _.ContainsRuntimeArray(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot load a runtime-sized array";
  }

  if (auto error = CheckMemoryAccess(_, inst, 3)) return error;

  if (_.HasCapability(spv::Capability::Shader) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id()) &&
      result_type->opcode() != spv::Op::OpTypePointer) {
    if (result_type->opcode() != spv::Op::OpTypeInt &&
        result_type->opcode() != spv::Op::OpTypeFloat &&
        result_type->opcode() != spv::Op::OpTypeVector &&
        result_type->opcode() != spv::Op::OpTypeMatrix) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "8- or 16-bit loads must be a scalar, vector or matrix type";
    }
  }

  _.RegisterQCOMImageProcessingTextureConsumer(pointer_id, inst, nullptr);

  return SPV_SUCCESS;
}